

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

uint __thiscall IDisk::GetTrackInfo(IDisk *this,MFMTrack *mfm_track,Track *track_buffer)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  pointer paVar4;
  pointer paVar5;
  uchar uVar6;
  uchar uVar7;
  unsigned_short uVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  int i;
  ulong uVar12;
  ILog *pIVar13;
  IDisk *pIVar14;
  IDisk *pIVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  value_type local_84;
  IDisk *local_60;
  CRC crc_local;
  
  CRC::CRC(&crc_local);
  uVar22 = mfm_track->size;
  uVar19 = 0;
  if (uVar22 < 0x40) {
LAB_00171142:
    CRC::~CRC(&crc_local);
    return uVar19;
  }
  uVar12 = 0;
  local_60 = this;
LAB_00170c06:
  uVar19 = (int)uVar12 - 0x50;
  do {
    uVar21 = (uint)uVar12;
    if (uVar22 - 0x40 <= uVar21) {
      paVar4 = (track_buffer->list_sector_).
               super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar5 = (track_buffer->list_sector_).
               super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar12 = ((long)paVar5 - (long)paVar4) / 0x24;
      if (paVar5 == paVar4) {
        uVar22 = 0;
        uVar19 = 0x100;
      }
      else {
        uVar10 = 0x100;
        iVar9 = 0;
        uVar21 = 0;
        uVar19 = 0;
        bVar24 = false;
        for (uVar16 = 0; uVar17 = (ulong)uVar16, uVar17 < uVar12; uVar16 = uVar16 + 1) {
          if (uVar17 != 0) {
            iVar9 = (iVar9 - uVar21) + paVar4[uVar17].idam_offset + -0x18;
          }
          uVar21 = paVar4[uVar17].dam_offset;
          uVar20 = (uint)paVar4[uVar17].real_size;
          uVar18 = uVar20 * 0x10 + uVar21 + 0x24;
          if ((uVar18 <= uVar19) || ((bool)(0xffff < uVar20 + uVar10 | bVar24))) {
            if (uVar17 < uVar12 - 1 && 1 < uVar12) {
              uVar2 = paVar4[uVar16 + 1].idam_offset;
              uVar1 = uVar2 + 0xa0;
              if (uVar1 < uVar18) {
                paVar4[uVar17].index_end = uVar1;
                uVar20 = (uVar2 - uVar21) + 0x70 >> 4;
                paVar4[uVar17].real_size = (unsigned_short)uVar20;
              }
            }
            else {
              uVar20 = ((uVar22 + 100) - uVar21) + paVar4->idam_offset >> 4;
              paVar4[uVar17].real_size = (unsigned_short)uVar20;
            }
          }
          else {
            bVar24 = uVar22 < uVar18;
            if (uVar22 < uVar18) {
              uVar20 = (uVar22 - uVar21) + paVar4->idam_offset + 0x1c >> 4;
              paVar4[uVar17].real_size = (unsigned_short)uVar20;
            }
            uVar19 = paVar4[uVar17].index_end;
          }
          uVar10 = uVar10 + (uVar20 & 0xffff);
          bVar24 = (bool)(bVar24 | uVar22 < (uVar20 & 0xffff) * 0x10 + uVar21 + 0x24);
          uVar21 = paVar4[uVar17].index_end;
        }
        track_buffer->gap3_size_ = (int)((ulong)(long)(iVar9 / 0x10) / uVar12);
        uVar22 = uVar10 + 0x100;
        uVar19 = uVar10 + 0x100;
        if ((char)uVar10 == '\0') {
          uVar22 = uVar10;
          uVar19 = uVar10;
        }
      }
      track_buffer->full_size_ = uVar22;
      goto LAB_00171142;
    }
    if (0x50 < uVar21) {
      puVar3 = mfm_track->bitfield;
      iVar9 = bcmp(&DAT_001aab80,puVar3 + (uVar12 & 0xffffffff),0x40);
      if (iVar9 == 0) {
        bVar24 = true;
        uVar12 = 0;
        uVar10 = uVar19;
        while ((uVar12 < 0x28 && (bVar24))) {
          if ((puVar3[uVar10] == '\x01') && (puVar3[uVar10 + 1] == '\0')) {
            bVar24 = true;
          }
          else {
            bVar24 = false;
          }
          uVar12 = uVar12 + 1;
          uVar10 = uVar10 + 2;
        }
        if (bVar24) break;
      }
    }
    uVar12 = (ulong)(uVar21 + 1);
    uVar19 = uVar19 + 1;
  } while( true );
  CRC::Reset(&crc_local);
  CRC::AddByteToCrc(&crc_local,0xa1);
  CRC::AddByteToCrc(&crc_local,0xa1);
  CRC::AddByteToCrc(&crc_local,0xa1);
  pIVar14 = (IDisk *)&crc_local;
  CRC::AddByteToCrc(&crc_local,0xfe);
  local_84.dam_sync_offset = 0;
  local_84.data_crc_ok = false;
  local_84._29_3_ = 0;
  local_84.index_end = 0;
  local_84.c = '\0';
  local_84.h = '\0';
  local_84.r = '\0';
  local_84.n = '\0';
  local_84.chrn_crc_ok = false;
  local_84.status1 = '\0';
  local_84.status2 = '\0';
  local_84._15_1_ = 0;
  local_84.real_size = 0;
  local_84._18_2_ = 0;
  local_84.dam_offset = 0;
  local_84.idam_offset = uVar21;
  local_84.idam_sync_offset = uVar21 - 0x50;
  uVar6 = GetNextByte(pIVar14,mfm_track,uVar21 + 0x40);
  local_84.c = uVar6;
  pIVar14 = (IDisk *)&crc_local;
  CRC::AddByteToCrc(&crc_local,uVar6);
  pIVar15 = local_60;
  uVar6 = GetNextByte(pIVar14,mfm_track,uVar21 + 0x50);
  local_84.h = uVar6;
  pIVar14 = (IDisk *)&crc_local;
  CRC::AddByteToCrc(&crc_local,uVar6);
  uVar6 = GetNextByte(pIVar14,mfm_track,uVar21 + 0x60);
  local_84.r = uVar6;
  pIVar14 = (IDisk *)&crc_local;
  CRC::AddByteToCrc(&crc_local,uVar6);
  uVar6 = GetNextByte(pIVar14,mfm_track,uVar21 + 0x70);
  local_84.n = uVar6;
  CRC::AddByteToCrc(&crc_local,uVar6);
  pIVar14 = (IDisk *)pIVar15->log_;
  if (pIVar14 == (IDisk *)0x0) {
LAB_00170dbf:
    pIVar13 = (ILog *)0x0;
  }
  else {
    (**pIVar14->_vptr_IDisk)(pIVar14,"CHRN Found");
    pIVar14 = (IDisk *)pIVar15->log_;
    if (pIVar14 == (IDisk *)0x0) goto LAB_00170dbf;
    (*pIVar14->_vptr_IDisk[1])(pIVar14,local_84._8_8_ & 0xff);
    pIVar14 = (IDisk *)pIVar15->log_;
    if (pIVar14 == (IDisk *)0x0) goto LAB_00170dbf;
    (*pIVar14->_vptr_IDisk[1])(pIVar14,(ulong)local_84._8_8_ >> 8 & 0xff);
    pIVar14 = (IDisk *)pIVar15->log_;
    if (pIVar14 == (IDisk *)0x0) goto LAB_00170dbf;
    (*pIVar14->_vptr_IDisk[1])(pIVar14,(ulong)local_84._8_8_ >> 0x10 & 0xff);
    pIVar14 = (IDisk *)pIVar15->log_;
    if (pIVar14 == (IDisk *)0x0) goto LAB_00170dbf;
    (*pIVar14->_vptr_IDisk[1])(pIVar14,(ulong)local_84._8_8_ >> 0x18 & 0xff);
    pIVar13 = pIVar15->log_;
  }
  uVar6 = GetNextByte(pIVar14,mfm_track,uVar21 + 0x80);
  uVar7 = GetNextByte(pIVar14,mfm_track,uVar21 + 0x90);
  uVar8 = CONCAT11(uVar6,uVar7);
  if (uVar8 != crc_local.computed_crc_) {
    local_84._8_8_ = local_84._8_8_ | 0x200000000000;
    if (pIVar13 == (ILog *)0x0) goto LAB_00170e21;
    (*(code *)**(undefined8 **)pIVar13)(pIVar13,"HEADER CRC ERROR !");
    pIVar13 = pIVar15->log_;
  }
  if (pIVar13 != (ILog *)0x0) {
    (**(code **)(*(long *)pIVar13 + 0x20))(pIVar13);
  }
LAB_00170e21:
  uVar21 = uVar21 + 0xa0;
  bVar24 = false;
  do {
    pIVar14 = (IDisk *)&crc_local;
    uVar22 = mfm_track->size;
    uVar12 = (ulong)uVar21;
    while( true ) {
      uVar19 = (uint)uVar12;
      if ((uVar22 - 0x38 <= uVar19) || (bVar24)) goto LAB_00170c06;
      iVar9 = bcmp(&DAT_001aab40,mfm_track->bitfield + uVar12,0x38);
      bVar24 = iVar9 == 0;
      if (bVar24) break;
      uVar12 = uVar12 + 1;
    }
    local_84.dam_sync_offset = uVar19 - 0x50;
    local_84.dam_offset = uVar19;
    CRC::Reset((CRC *)pIVar14);
    CRC::AddByteToCrc((CRC *)pIVar14,0xa1);
    CRC::AddByteToCrc((CRC *)pIVar14,0xa1);
    pIVar15 = pIVar14;
    CRC::AddByteToCrc((CRC *)pIVar14,0xa1);
    uVar6 = GetNextByte(pIVar15,mfm_track,uVar19 + 0x30);
    CRC::AddByteToCrc((CRC *)pIVar14,uVar6);
    if (uVar6 == 0xf8) {
      local_84._8_8_ = local_84._8_8_ | 0x40000000000000;
    }
    uVar12 = uVar12 + 0x40;
    bVar11 = local_84.n;
    if (7 < local_84.n) {
      bVar11 = 8;
    }
    iVar9 = 0x80 << (bVar11 & 0x1f);
    while( true ) {
      bVar23 = iVar9 == 0;
      iVar9 = iVar9 + -1;
      uVar22 = (uint)uVar12;
      if (bVar23) break;
      uVar6 = GetNextByte(pIVar14,mfm_track,uVar22);
      pIVar14 = (IDisk *)&crc_local;
      CRC::AddByteToCrc((CRC *)pIVar14,uVar6);
      uVar19 = mfm_track->size;
      if (uVar22 + 0x10 < mfm_track->size) {
        uVar19 = 0;
      }
      uVar12 = (ulong)((uVar22 + 0x10) - uVar19);
      local_84.real_size = local_84.real_size + 1;
    }
    if (uVar22 < mfm_track->size - 0x20) {
      uVar6 = GetNextByte(pIVar14,mfm_track,uVar22);
      uVar7 = GetNextByte(pIVar14,mfm_track,uVar22 + 0x10);
      uVar8 = CONCAT11(uVar6,uVar7);
      uVar22 = uVar22 + 0x20;
    }
    if (uVar8 == crc_local.computed_crc_) {
LAB_00170f86:
      if (local_60->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)local_60->log_ + 0x20))();
      }
    }
    else {
      local_84._8_8_ = local_84._8_8_ | 0x20200000000000;
      pIVar13 = local_60->log_;
      if (pIVar13 != (ILog *)0x0) {
        (*(code *)**(undefined8 **)pIVar13)(pIVar13,"DATA CRC ERROR !");
        goto LAB_00170f86;
      }
    }
    local_84.index_end = uVar22;
    std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::push_back
              (&track_buffer->list_sector_,&local_84);
    uVar21 = local_84.dam_offset + 0x41;
  } while( true );
}

Assistant:

unsigned int IDisk::GetTrackInfo(MFMTrack* mfm_track, Track* track_buffer)
{
   unsigned int size;
   CRC crc_local;
   // Compute size of track :
   // Header
   size = 256;

   unsigned int index = 0;
   // States :
   // 0 - waiting for next sector id
   // 1 - waiting for next sector data
   // 2 - waiting for end of datas

   // A1 = 4489, FE =
   const char pattern_fe[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 0
   };
   const char pattern_f[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1
   };

   if (mfm_track->size < (int)sizeof(pattern_fe))
   {
      return 0;
   }
   while (index < mfm_track->size - (int)sizeof(pattern_fe))
   {
      // Test the pervious 8 bytes (should be '00')
      bool sync_ok = (index > SYNC_BIT_NUMBER * 2);

      if (sync_ok)
      {
         sync_ok = (memcmp(pattern_fe, &mfm_track->bitfield[index], sizeof(pattern_fe)) == 0);
         if (sync_ok)
         {
            for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
            {
               if (mfm_track->bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                  || mfm_track->bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0)
               {
                  sync_ok = false;
               }
            }
         }
      }

      if (sync_ok)
      {
         // Found ! New sector
         crc_local.Reset();
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xFE);

         Sector sector;
         memset(&sector, 0, sizeof(sector));
         // Keep the offset position !
         sector.idam_offset = index;
         sector.idam_sync_offset = index - SYNC_BIT_NUMBER * 2;

         // Adding CHRN to the next sector
         index += sizeof(pattern_fe);

         sector.c = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.c);
         index += 16;
         sector.h = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.h);
         index += 16;
         sector.r = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.r);
         index += 16;
         sector.n = GetNextByte(mfm_track, index);
         crc_local.AddByteToCrc(sector.n);
         index += 16;

         LOG("CHRN Found");
         LOGB(sector.c );
         LOGB(sector.h );
         LOGB(sector.r );
         LOGB(sector.n );

         // Do we have CRC error ?
         unsigned short crc = GetNextByte(mfm_track, index);
         crc <<= 8;
         index += 16;
         crc |= GetNextByte(mfm_track, index);
         index += 16;

         // Set status 1
         if (crc != crc_local.GetCRC())
         {
            sector.status1 |= 0x20;
            LOG("HEADER CRC ERROR !");
         }
         LOGEOL
         // Now, waiting for A1A1A1F8/B
         bool data_found = false;
         while ((index < mfm_track->size - (int)sizeof(pattern_f)) && (!data_found))
         {
            if (memcmp(pattern_f, &mfm_track->bitfield[index], sizeof(pattern_f)) == 0)
            {
               data_found = true;
               // Keep the offset position
               sector.dam_offset = index;
               sector.dam_sync_offset = index - SYNC_BIT_NUMBER * 2; // todo : Add verify

               // Yeah
               index += sizeof(pattern_f) - 8;

               // Set the Status according to the F8/FB
               crc_local.Reset();
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               unsigned char byte = GetNextByte(mfm_track, index);
               crc_local.AddByteToCrc(byte);
               index += 16;

               if (byte == 0xF8) // Erased
               {
                  sector.status2 |= 0x40;
               }

               // Now, gather datas...
               int sectorsize = (0x80 << (std::min(sector.n, (unsigned char)0x8)));
               for (int data_count = 0;
                    data_count < sectorsize; data_count++)
               {
                  byte = GetNextByte(mfm_track, index);
                  crc_local.AddByteToCrc(byte);
                  index += 16;
                  if (index >= mfm_track->size)
                  {
                     index = index - mfm_track->size;
                  }

                  sector.real_size++;
               }
               if (index < mfm_track->size - 32)
               {
                  // CRC Check
                  crc = GetNextByte(mfm_track, index);
                  crc <<= 8;
                  index += 16;
                  crc |= GetNextByte(mfm_track, index);
                  index += 16;
               }
               else
               {
               }
               // Set status 1
               if (crc != crc_local.GetCRC())
               {
                  sector.status1 |= 0x20;
                  sector.status2 |= 0x20;
                  LOG("DATA CRC ERROR !");
               }
               LOGEOL
               // Keep this to compute GAP3 size
               sector.index_end = index;

               track_buffer->list_sector_.push_back(sector);

               size += sector.real_size;

               // Adaptation: rewind to sector.DAMOffset to avoid forgetting interlaced sectors
               index = sector.dam_offset + 64 + 1;
            }
            else
            {
               ++index;
            }
         }

         // Next sector
      }
      else
      {
         ++index;
      }
   }

   // Avegare GAP3 size :
   int gap_3_total = 0;
   unsigned int offset_end = 0;
   unsigned int max_index = 0;
   bool whole_track_recorded = false;
   unsigned int finalsize = 256;

   if (track_buffer->list_sector_.size() > 0)
   {
      for (unsigned int i = 0; i < track_buffer->list_sector_.size(); i++)
      {
         if (i > 0)
         {
            gap_3_total += track_buffer->list_sector_[i].idam_offset - 24 - offset_end;
         }

         // check size :
         //if ( track_buffer->listSector.size() > 1 && i < track_buffer->listSector.size()-1 )
         {
            // Interlaced sector :
            // Add full sector if :
            // - MaxIndex < endIndex (AND whole track is not recorded)
            // - totalsize + RealSize < 0x10000 (otherwise = problem with dsk header)
            if (max_index < track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16
               && !whole_track_recorded
               && (finalsize + track_buffer->list_sector_[i].real_size) < 0x10000)
            {
               if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > mfm_track->size)
               {
                  // Skip to first IDAM found
                  track_buffer->list_sector_[i].real_size = static_cast<unsigned short>((mfm_track->size - (track_buffer->list_sector_[i
                  ].dam_offset + 0x24) + track_buffer->list_sector_[0].idam_offset + 64) / 16);
                  whole_track_recorded = true;
               }
               max_index = track_buffer->list_sector_[i].index_end;
            }
               // Otherwise :
               // Add until IDAMOffset + 160 bye ( 4 for idam, 4 for chrn, 4 for CRC)
            else
            {
               if (track_buffer->list_sector_.size() > 1 && i < track_buffer->list_sector_.size() - 1)
               {
                  if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > track_buffer->
                     list_sector_[i + 1].idam_offset + 160)
                  {
                     //track_buffer->listSector[i].RealSize -= (track_buffer->listSector[i].indexEnd - (track_buffer->listSector[i+1].IDAMOffset + 160))/16;
                     track_buffer->list_sector_[i].index_end = track_buffer->list_sector_[i + 1].idam_offset + 160;
                     track_buffer->list_sector_[i].real_size = (track_buffer->list_sector_[i].index_end - (track_buffer->list_sector_[i].
                        dam_offset + (3 * 16))) / 16;
                  }
               }
               else
               {
                  // Last track : go until begining of first sector
                  track_buffer->list_sector_[i].real_size = static_cast<unsigned short>((mfm_track->size - track_buffer->list_sector_[i]
                     .dam_offset + 0x24 + track_buffer->list_sector_[0].idam_offset + 64) / 16);
               }
            }
            if (track_buffer->list_sector_[i].dam_offset + 0x24 + track_buffer->list_sector_[i].real_size * 16 > mfm_track->size)
            {
               whole_track_recorded = true;
            }
         }
         finalsize += track_buffer->list_sector_[i].real_size;

         offset_end = track_buffer->list_sector_[i].index_end;
      }
      //gap_3_total += trackIn->Revolution[0].Size - offset_end;

      track_buffer->gap3_size_ = gap_3_total / 16 / track_buffer->list_sector_.size();

      if ((finalsize & 0xFFFFFF00) < finalsize)
      {
         finalsize += 0x100;
      }
      track_buffer->full_size_ = finalsize;
   }
   else
   {
      track_buffer->full_size_ = 0;
   }


   // TODO : Compute real size of track
   return finalsize;
}